

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es.c
# Opt level: O1

int esMain(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  bool_t bVar3;
  u32 uVar4;
  err_t eVar5;
  err_t eVar6;
  size_t sVar7;
  char *pcVar8;
  file_t file;
  tm_ticks_t tVar9;
  tm_ticks_t tVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char source [6];
  octet buf [2048];
  char local_86e [6];
  ulong local_868;
  size_t local_860;
  err_t local_854;
  file_t local_850;
  ulong local_848;
  ulong local_840;
  size_t local_838 [257];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  es print\n    list available entropy sources and determine their health\n  es read <source> <count> <file>\n    read <count> Kbytes from <source> and store them in <file>\n  <source> in {trng, trng2, sys, sys2, timer, timerNN}\n    timerNNN -- use NNN sleep delays to produce one output bit\n"
           ,"es","monitor entropy sources");
    return -1;
  }
  iVar2 = strCmp(argv[1],"print");
  if (iVar2 == 0) {
    eVar6 = 0x25b;
    if (argc == 2) {
      printf("Sources:");
      lVar11 = 0;
      lVar13 = 0;
      do {
        pcVar8 = *(char **)((long)&PTR_anon_var_dwarf_4b30_0014f890 + lVar11);
        eVar6 = rngESRead(local_838,(void *)0x0,0,pcVar8);
        if (eVar6 == 0) {
          eVar6 = rngESTest(pcVar8);
          printf(" %s%c",pcVar8,(ulong)((uint)(eVar6 != 0) * 2 + 0x2b));
          lVar13 = lVar13 + 1;
        }
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x28);
      pcVar8 = "\n";
      if (lVar13 == 0) {
        pcVar8 = " none\n";
      }
      eVar6 = 0;
      printf(pcVar8);
      eVar5 = rngESHealth();
      printf("Health (at least two healthy sources): %c\n",(ulong)((uint)(eVar5 != 0) * 2 + 0x2b));
      eVar5 = rngESHealth2();
      printf("Health2 (there is a healthy physical source): %c\n",
             (ulong)((uint)(eVar5 != 0) * 2 + 0x2b));
      puts("\\warning health is volatile");
    }
    goto LAB_0010b478;
  }
  iVar2 = strCmp(argv[1],"read");
  eVar6 = 0x259;
  if ((iVar2 != 0) || (eVar6 = 0x25b, argc != 5)) goto LAB_0010b478;
  iVar2 = strCmp(argv[2],"trng");
  if (iVar2 == 0) {
    pcVar8 = "trng";
LAB_0010b4d1:
    strCopy(local_86e,pcVar8);
    uVar12 = 0;
  }
  else {
    iVar2 = strCmp(argv[2],"trng2");
    if (iVar2 == 0) {
      pcVar8 = "trng2";
      goto LAB_0010b4d1;
    }
    iVar2 = strCmp(argv[2],"sys");
    if (iVar2 == 0) {
      pcVar8 = "sys";
      goto LAB_0010b4d1;
    }
    iVar2 = strCmp(argv[2],"timer");
    if (iVar2 == 0) {
      pcVar8 = "timer";
      goto LAB_0010b4d1;
    }
    bVar3 = strStartsWith(argv[2],"timer");
    if (bVar3 == 0) goto LAB_0010b478;
    strCopy(local_86e,"timer");
    sVar7 = strLen("timer");
    pcVar8 = argv[2];
    argv[2] = pcVar8 + sVar7;
    bVar3 = decIsValid(pcVar8 + sVar7);
    if ((((bVar3 == 0) || (sVar7 = strLen(argv[2]), sVar7 == 0)) ||
        (sVar7 = strLen(argv[2]), 3 < sVar7)) || (sVar7 = decCLZ(argv[2]), sVar7 != 0))
    goto LAB_0010b478;
    uVar4 = decToU32(argv[2]);
    uVar12 = (ulong)uVar4;
  }
  bVar3 = decIsValid(argv[3]);
  if (((bVar3 != 0) && (sVar7 = strLen(argv[3]), sVar7 != 0)) &&
     ((sVar7 = strLen(argv[3]), sVar7 < 5 && (sVar7 = decCLZ(argv[3]), sVar7 == 0)))) {
    uVar4 = decToU32(argv[3]);
    eVar6 = cmdFileValNotExist(1,argv + 4);
    if (eVar6 == 0) {
      file = fileOpen(argv[4],"wb");
      if (file == (file_t)0x0) {
        eVar6 = 0xcb;
      }
      else {
        uVar15 = (ulong)uVar4 << 10;
        local_850 = file;
        local_840 = uVar12;
        do {
          if (uVar15 == 0) {
            bVar3 = fileClose(file);
            eVar6 = 0x67;
            if (bVar3 != 0) {
              eVar6 = 0;
            }
            break;
          }
          local_868 = 0x800;
          if (uVar15 < 0x800) {
            local_868 = uVar15;
          }
          iVar2 = strCmp(local_86e,"trng");
          if (((iVar2 == 0) || (iVar2 = strCmp(local_86e,"trng2"), iVar2 == 0)) ||
             ((iVar2 = strCmp(local_86e,"sys"), iVar2 == 0 ||
              ((iVar2 = strCmp(local_86e,"timer"), uVar12 == 0 && (iVar2 == 0)))))) {
            eVar6 = rngESRead(&local_860,local_838,local_868,local_86e);
          }
          else {
            uVar14 = 0;
            local_848 = uVar15;
            do {
              *(undefined1 *)((long)local_838 + uVar14) = 0;
              tVar9 = tmTicks();
              lVar11 = 0;
              do {
                uVar15 = 0;
                for (; uVar12 != 0; uVar12 = uVar12 - 1) {
                  mtSleep(0);
                  tVar10 = tmTicks();
                  uVar15 = uVar15 ^ tVar10 - tVar9;
                  tVar9 = tVar10;
                }
                bVar3 = u64Parity(uVar15);
                *(byte *)((long)local_838 + uVar14) =
                     *(byte *)((long)local_838 + uVar14) ^ (byte)(bVar3 << ((byte)lVar11 & 0x1f));
                lVar11 = lVar11 + 1;
                uVar12 = local_840;
              } while (lVar11 != 8);
              uVar14 = uVar14 + 1;
            } while (uVar14 != local_868);
            local_860 = local_868;
            eVar6 = 0;
            file = local_850;
            uVar15 = local_848;
          }
          if (eVar6 == 0) {
            if (local_860 != local_868) {
              fileClose(file);
              eVar6 = 0xcf;
              goto LAB_0010b6ff;
            }
            sVar7 = fileWrite2(file,local_838,local_860);
            if (sVar7 != local_860) {
              fileClose(file);
              eVar6 = 0xce;
              goto LAB_0010b6ff;
            }
            uVar15 = uVar15 - local_860;
            bVar1 = true;
            eVar6 = local_854;
          }
          else {
            fileClose(file);
LAB_0010b6ff:
            bVar1 = false;
          }
          local_854 = eVar6;
        } while (bVar1);
      }
    }
  }
LAB_0010b478:
  if (eVar6 != 0) {
    pcVar8 = errMsg(eVar6);
    printf("bee2cmd/%s: %s\n","es",pcVar8);
  }
  return eVar6;
}

Assistant:

int esMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return esUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "print"))
		code = esPrint(argc - 1, argv + 1);
	else if (strEq(argv[0], "read"))
		code = esRead(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return (int)code;
}